

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint16 *__ptr;
  stbi__uint16 *psVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (stbi__uint16 *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,0x10);
  if (__ptr == (stbi__uint16 *)0x0) {
    __ptr = (stbi__uint16 *)0x0;
  }
  else {
    if (local_3c.bits_per_channel != 0x10) {
      iVar2 = req_comp;
      if (req_comp == 0) {
        iVar2 = *comp;
      }
      uVar4 = *y * *x * iVar2;
      psVar1 = (stbi__uint16 *)malloc((long)(int)(uVar4 * 2));
      if (psVar1 == (stbi__uint16 *)0x0) {
        stbi__g_failure_reason = "outofmem";
        __ptr = psVar1;
      }
      else {
        for (uVar3 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar3; uVar3 = uVar3 + 1) {
          psVar1[uVar3] = (ushort)*(byte *)((long)__ptr + uVar3) * 0x101;
        }
        free(__ptr);
        __ptr = psVar1;
      }
    }
    if (stbi__vertically_flip_on_load != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(__ptr,*x,*y,req_comp * 2);
    }
  }
  return __ptr;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 16) {
      STBI_ASSERT(ri.bits_per_channel == 8);
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}